

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O2

bool curl_perform_with_retry(string *url,CURL *curl,int max_attempts,int retry_delay_seconds)

{
  int iVar1;
  common_log *pcVar2;
  undefined8 uVar3;
  int __exponent;
  double dVar4;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  for (__exponent = 0; __exponent != 3; __exponent = __exponent + 1) {
    if (-1 < common_log_verbosity_thold) {
      pcVar2 = common_log_main();
      common_log_add(pcVar2,GGML_LOG_LEVEL_INFO,
                     "%s: Trying to download from %s (attempt %d of %d)...\n",
                     "curl_perform_with_retry",(url->_M_dataplus)._M_p,(ulong)(__exponent + 1),3);
    }
    iVar1 = curl_easy_perform(curl);
    if (iVar1 == 0) goto LAB_0014192e;
    dVar4 = ldexp(1.0,__exponent);
    if (-1 < common_log_verbosity_thold) {
      pcVar2 = common_log_main();
      uVar3 = curl_easy_strerror(iVar1);
      common_log_add(pcVar2,GGML_LOG_LEVEL_WARN,
                     "%s: curl_easy_perform() failed: %s, retrying after %d milliseconds...\n",
                     "curl_perform_with_retry",uVar3,(ulong)(uint)(int)(dVar4 * 1000.0));
    }
    local_38.__r = (rep)(int)(dVar4 * 1000.0);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
  }
  if (-1 < common_log_verbosity_thold) {
    pcVar2 = common_log_main();
    common_log_add(pcVar2,GGML_LOG_LEVEL_ERROR,"%s: curl_easy_perform() failed after %d attempts\n",
                   "curl_perform_with_retry",3);
  }
LAB_0014192e:
  return __exponent != 3;
}

Assistant:

static bool curl_perform_with_retry(const std::string & url, CURL * curl, int max_attempts, int retry_delay_seconds) {
    int remaining_attempts = max_attempts;

    while (remaining_attempts > 0) {
        LOG_INF("%s: Trying to download from %s (attempt %d of %d)...\n", __func__ , url.c_str(), max_attempts - remaining_attempts + 1, max_attempts);

        CURLcode res = curl_easy_perform(curl);
        if (res == CURLE_OK) {
            return true;
        }

        int exponential_backoff_delay = std::pow(retry_delay_seconds, max_attempts - remaining_attempts) * 1000;
        LOG_WRN("%s: curl_easy_perform() failed: %s, retrying after %d milliseconds...\n", __func__, curl_easy_strerror(res), exponential_backoff_delay);

        remaining_attempts--;
        std::this_thread::sleep_for(std::chrono::milliseconds(exponential_backoff_delay));
    }

    LOG_ERR("%s: curl_easy_perform() failed after %d attempts\n", __func__, max_attempts);

    return false;
}